

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

size_t mpack_node_strlen(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_str) {
      node_local.tree = (mpack_tree_t *)(ulong)(node.data)->len;
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (size_t)node_local.tree;
}

Assistant:

MPACK_INLINE size_t mpack_node_strlen(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_str)
        return (size_t)node.data->len;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}